

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  int iVar1;
  Arena *this_00;
  RepeatedField<int> *this_01;
  Extension *pEVar2;
  MessageLite *pMVar3;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar4;
  
  pVar4 = Insert(this,number);
  pEVar2 = pVar4.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar2->type = type;
    pEVar2->is_repeated = true;
    pEVar2->is_packed = packed;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) {
      pMVar3 = (MessageLite *)operator_new(0x10);
      pMVar3->_vptr_MessageLite = (_func_int **)0x0;
      pMVar3[1]._vptr_MessageLite = (_func_int **)0x0;
    }
    else {
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&RepeatedField<int>::typeinfo,0x10);
      }
      pMVar3 = (MessageLite *)
               ArenaImpl::AllocateAlignedAndAddCleanup
                         (&this_00->impl_,0x10,
                          arena_destruct_object<google::protobuf::RepeatedField<int>>);
      pMVar3->_vptr_MessageLite = (_func_int **)0x0;
      pMVar3[1]._vptr_MessageLite = (_func_int **)this_00;
    }
    (pEVar2->field_0).message_value = pMVar3;
  }
  this_01 = (pEVar2->field_0).repeated_int32_value;
  if (this_01->current_size_ == this_01->total_size_) {
    RepeatedField<int>::Reserve(this_01,this_01->total_size_ + 1);
  }
  iVar1 = this_01->current_size_;
  this_01->current_size_ = iVar1 + 1;
  *(int *)((long)this_01->arena_or_elements_ + (long)iVar1 * 4) = value;
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}